

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

Vec_Vec_t * Ivy_ManLevelize(Ivy_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  void **ppvVar2;
  void *Entry;
  void *pvVar3;
  Vec_Ptr_t *p_01;
  int i;
  long lVar4;
  uint local_3c;
  
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  p_00->pArray = ppvVar2;
  local_3c = 0;
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return (Vec_Vec_t *)p_00;
    }
    Entry = Vec_PtrEntry(p->vObjs,i);
    if (Entry != (void *)0x0) {
      uVar1 = *(uint *)((long)Entry + 8) & 0xf;
      if (uVar1 == 7) {
        __assert_fail("!Ivy_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                      ,0xe8,"Vec_Vec_t *Ivy_ManLevelize(Ivy_Man_t *)");
      }
      if (0xfffffffd < uVar1 - 7) {
        uVar1 = *(uint *)((long)Entry + 8) >> 0xb;
        if (local_3c <= uVar1) {
          local_3c = uVar1 + 1;
          Vec_PtrGrow(p_00,local_3c);
          for (lVar4 = (long)p_00->nSize; lVar4 <= (long)(ulong)uVar1; lVar4 = lVar4 + 1) {
            pvVar3 = calloc(1,0x10);
            p_00->pArray[lVar4] = pvVar3;
          }
          p_00->nSize = local_3c;
        }
        p_01 = Vec_VecEntry((Vec_Vec_t *)p_00,uVar1);
        Vec_PtrPush(p_01,Entry);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Ivy_ManLevelize( Ivy_Man_t * p )
{
    Vec_Vec_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    vNodes = Vec_VecAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        assert( !Ivy_ObjIsBuf(pObj) );
        if ( Ivy_ObjIsNode(pObj) )
            Vec_VecPush( vNodes, pObj->Level, pObj );
    }
    return vNodes;
}